

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O1

ion_status_t flat_file_update(ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value)

{
  ion_fpos_t iVar1;
  byte bVar2;
  char cVar3;
  ion_status_t iVar4;
  uint uVar5;
  ion_status_t iVar6;
  ulong uVar7;
  ion_fpos_t loc;
  ion_flat_file_row_t row;
  ion_fpos_t local_70;
  ion_value_t local_68;
  ion_flat_file_row_t local_60;
  ion_flat_file_row_t local_48;
  
  local_70 = -1;
  local_68 = value;
  if (flat_file->sorted_mode == '\0') {
LAB_00107c57:
    uVar7 = 0;
    while( true ) {
      bVar2 = flat_file_scan(flat_file,local_70,&local_70,&local_48,'\x01',
                             flat_file_predicate_key_match,key);
      iVar1 = local_70;
      if (bVar2 != 0) break;
      local_60.row_status = '\x01';
      local_60.value = local_68;
      local_60.key = key;
      bVar2 = flat_file_write_row(flat_file,local_70,&local_60);
      if (bVar2 != 0) goto LAB_00107ccc;
      uVar7 = (ulong)((int)uVar7 + 1);
      local_70 = iVar1 + 1;
    }
    if ((int)uVar7 != 0 || bVar2 != 0xe) {
      iVar6.error = '\0';
      iVar6._1_3_ = 0;
      iVar6.count = 0;
      uVar5 = 0;
      iVar4._1_7_ = 0;
      iVar4.error = bVar2;
      if (bVar2 == 0xe) {
        iVar4 = iVar6;
      }
      goto LAB_00107d10;
    }
LAB_00107ce2:
    iVar4 = flat_file_insert(flat_file,key,local_68);
    uVar7 = (ulong)iVar4 >> 0x20;
    uVar5 = iVar4._0_4_;
  }
  else {
    bVar2 = flat_file_binary_search(flat_file,key,&local_70);
    if (bVar2 == 0) {
      bVar2 = flat_file_read_row(flat_file,local_70,&local_48);
      if (bVar2 == 0) {
        cVar3 = (*(flat_file->super).compare)(local_48.key,key,(flat_file->super).record.key_size);
        if (cVar3 == '\0') goto LAB_00107c57;
        goto LAB_00107ce2;
      }
    }
    else if (bVar2 == 1) goto LAB_00107ce2;
    uVar7 = 0;
LAB_00107ccc:
    iVar4._1_7_ = 0;
    iVar4.error = bVar2;
    uVar5 = 0;
  }
LAB_00107d10:
  return (ion_status_t)((ulong)iVar4 & 0xff | (ulong)(uVar5 & 0xffffff00) | uVar7 << 0x20);
}

Assistant:

ion_status_t
flat_file_update(
	ion_flat_file_t *flat_file,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_status_t status		= ION_STATUS_INITIALIZE;

	ion_fpos_t			loc = -1;
	ion_flat_file_row_t row;
	ion_err_t			err;

	if (flat_file->sorted_mode) {
		err = flat_file_binary_search(flat_file, key, &loc);

		if (err_ok != err) {
			if (err_item_not_found == err) {
				/* Key didn't exist, do upsert. This may fail because it violates the sorted order. */
				return flat_file_insert(flat_file, key, value);
			}

			status.error = err;
			return status;
		}

		err = flat_file_read_row(flat_file, loc, &row);

		if (err_ok != err) {
			status.error = err;
			return status;
		}

		if (0 != flat_file->super.compare(row.key, key, flat_file->super.record.key_size)) {
			/* Key didn't exist, do upsert. */
			return flat_file_insert(flat_file, key, value);
		}
	}

	while (err_ok == (err = flat_file_scan(flat_file, loc, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, key))) {
		ion_err_t row_err = flat_file_write_row(flat_file, loc, &(ion_flat_file_row_t) { ION_FLAT_FILE_STATUS_OCCUPIED, key, value });

		if (err_ok != row_err) {
			status.error = row_err;
			return status;
		}

		status.count++;
		/* Move one-forwards to skip the one we just updated */
		loc++;
	}

	status.error = err_ok;

	if ((err == err_file_hit_eof) && (status.count == 0)) {
		/* If this is the case, then we had nothing to update. Do an upsert instead */
		return flat_file_insert(flat_file, key, value);
	}
	else if (err != err_file_hit_eof) {
		status.error = err;
	}

	return status;
}